

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O2

bool __thiscall cmParseBlanketJSCoverage::ReadJSONFile(cmParseBlanketJSCoverage *this,string *file)

{
  cmCTest *this_00;
  ostream *poVar1;
  JSONParser parser;
  char *local_1b0 [4];
  ostringstream cmCTestLog_msg;
  
  parser.Coverage = this->Coverage;
  parser._vptr_JSONParser = (_func_int **)&PTR__JSONParser_00639ea8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Parsing ");
  poVar1 = std::operator<<(poVar1,(string *)file);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmParseBlanketJSCoverage.cxx"
               ,0x86,local_1b0[0],this->Coverage->Quiet);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  JSONParser::ParseFile(&parser,file);
  return true;
}

Assistant:

bool cmParseBlanketJSCoverage::ReadJSONFile(std::string const& file)
{
  cmParseBlanketJSCoverage::JSONParser parser(this->Coverage);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Parsing " << file << std::endl, this->Coverage.Quiet);
  parser.ParseFile(file);
  return true;
}